

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O3

void __thiscall Json::StyledWriter::~StyledWriter(StyledWriter *this)

{
  ~StyledWriter(this);
  operator_delete(this);
  return;
}

Assistant:

~StyledWriter() JSONCPP_OVERRIDE {}